

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

bool __thiscall QPushButton::event(QPushButton *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QPushButtonPrivate *this_00;
  QDialogPrivate *this_01;
  QEvent *in_RSI;
  QPushButtonPrivate *in_RDI;
  QDialog *dialog;
  QPushButtonPrivate *d;
  QWidget *in_stack_ffffffffffffffe0;
  QPushButtonPrivate *this_02;
  
  this_02 = in_RDI;
  this_00 = d_func((QPushButton *)0x666cf0);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == ParentChange) {
    this_01 = (QDialogPrivate *)QPushButtonPrivate::dialogParent(this_02);
    if ((this_01 != (QDialogPrivate *)0x0) && (((byte)this_00->field_0x2c8 >> 2 & 1) != 0)) {
      QDialog::d_func((QDialog *)0x666d3d);
      QDialogPrivate::setMainDefault(this_01,(QPushButton *)in_RDI);
    }
  }
  else {
    TVar2 = QEvent::type(in_RSI);
    if (TVar2 == StyleChange) {
      QPushButtonPrivate::resetLayoutItemMargins(this_00);
      QWidget::updateGeometry(in_stack_ffffffffffffffe0);
    }
    else {
      TVar2 = QEvent::type(in_RSI);
      if (TVar2 == PolishRequest) {
        QWidget::updateGeometry(in_stack_ffffffffffffffe0);
      }
    }
  }
  bVar1 = QAbstractButton::event((QAbstractButton *)this_02,in_RSI);
  return bVar1;
}

Assistant:

bool QPushButton::event(QEvent *e)
{
    Q_D(QPushButton);
    if (e->type() == QEvent::ParentChange) {
#if QT_CONFIG(dialog)
        if (QDialog *dialog = d->dialogParent()) {
            if (d->defaultButton)
                dialog->d_func()->setMainDefault(this);
        }
#endif
    } else if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
               || e->type() == QEvent::MacSizeChange
#endif
               ) {
        d->resetLayoutItemMargins();
        updateGeometry();
    } else if (e->type() == QEvent::PolishRequest) {
        updateGeometry();
    }
    return QAbstractButton::event(e);
}